

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_mdef_gen.c
# Opt level: O1

int32 make_CD_heap(hashelement_t **triphonehash,int32 threshold,heapelement_t ***CDheap,
                  int32 *cdheapsize)

{
  int32 heapsize;
  heapelement_t *newelement;
  char *pcVar1;
  long lVar2;
  hashelement_t *phVar3;
  heapelement_t **heap;
  heapelement_t **local_38;
  
  local_38 = (heapelement_t **)0x0;
  lVar2 = 0;
  heapsize = 0;
  do {
    for (phVar3 = triphonehash[lVar2]; phVar3 != (hashelement_t *)0x0; phVar3 = phVar3->next) {
      if (threshold <= phVar3->count) {
        newelement = (heapelement_t *)calloc(1,0x28);
        if (newelement == (heapelement_t *)0x0) {
          err_msg(ERR_FATAL,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                  ,0x29d,"Heap install error. Out of memory!\n");
          exit(1);
        }
        pcVar1 = strdup(phVar3->basephone);
        newelement->basephone = pcVar1;
        pcVar1 = strdup(phVar3->leftcontext);
        newelement->leftcontext = pcVar1;
        pcVar1 = strdup(phVar3->rightcontext);
        newelement->rightcontext = pcVar1;
        pcVar1 = strdup(phVar3->wordposition);
        newelement->wordposition = pcVar1;
        heapsize = insert(&local_38,heapsize,newelement);
      }
    }
    lVar2 = lVar2 + 1;
    if (lVar2 == 0x5dc1) {
      *CDheap = local_38;
      *cdheapsize = heapsize;
      return 0;
    }
  } while( true );
}

Assistant:

int32 make_CD_heap(hashelement_t  **triphonehash,
		   int32  threshold,
		   heapelement_t ***CDheap,
		   int32  *cdheapsize)
{
    heapelement_t **heap=NULL, *addtriphone;
    hashelement_t *triphone_el;
    int32 i, heapsize;

    heapsize = 0;
    for (i = 0; i < HASHSIZE; i++){
	triphone_el = triphonehash[i];
	while (triphone_el != NULL){
	    if (triphone_el->count >= threshold) {
		addtriphone = (heapelement_t *) calloc(1,sizeof(heapelement_t));
		if (addtriphone == NULL)
		    E_FATAL("Heap install error. Out of memory!\n");
		addtriphone->basephone = strdup(triphone_el->basephone);
		addtriphone->leftcontext = strdup(triphone_el->leftcontext);
		addtriphone->rightcontext = strdup(triphone_el->rightcontext);
	        addtriphone->wordposition = strdup(triphone_el->wordposition);
		heapsize = insert(&heap, heapsize, addtriphone);
            }
	    triphone_el = triphone_el->next;
        }
    }
    *CDheap = heap;
    *cdheapsize = heapsize;

    return S3_SUCCESS;
}